

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void blend_a64_d16_mask_w4_sse41
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m128i *m,
               __m128i *v_round_offset,__m128i *v_maxval,int shift)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RCX) [16];
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i res;
  __m128i res_e;
  __m128i res_d;
  __m128i res_c;
  __m128i res_a;
  __m128i m_max_minus_m;
  __m128i s0_s1;
  __m128i s1;
  __m128i s0;
  __m128i max_minus_m;
  
  auVar1 = vpsubw_avx(*in_R9,*in_RCX);
  auVar2 = auVar1;
  xx_loadl_64(in_RSI);
  auVar3 = auVar2;
  alVar4 = xx_loadl_64(in_RDX);
  auVar3 = vpunpcklwd_avx(auVar2,auVar3);
  auVar1 = vpunpcklwd_avx(*in_RCX,auVar1);
  auVar1 = vpmaddwd_avx(auVar3,auVar1);
  auVar1 = vpsubd_avx(auVar1,*in_R8);
  auVar1 = vpsrad_avx(auVar1,ZEXT416((uint)res[1]));
  auVar1 = vpackssdw_avx(auVar1,auVar1);
  vpackuswb_avx(auVar1,auVar1);
  alVar4[0] = (longlong)in_RSI;
  xx_storel_32(in_RDI,alVar4);
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w4_sse41(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m128i *m, const __m128i *v_round_offset, const __m128i *v_maxval,
    int shift) {
  const __m128i max_minus_m = _mm_sub_epi16(*v_maxval, *m);
  const __m128i s0 = xx_loadl_64(src0);
  const __m128i s1 = xx_loadl_64(src1);
  const __m128i s0_s1 = _mm_unpacklo_epi16(s0, s1);
  const __m128i m_max_minus_m = _mm_unpacklo_epi16(*m, max_minus_m);
  const __m128i res_a = _mm_madd_epi16(s0_s1, m_max_minus_m);
  const __m128i res_c = _mm_sub_epi32(res_a, *v_round_offset);
  const __m128i res_d = _mm_srai_epi32(res_c, shift);
  const __m128i res_e = _mm_packs_epi32(res_d, res_d);
  const __m128i res = _mm_packus_epi16(res_e, res_e);

  xx_storel_32(dst, res);
}